

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::NodeComplexityComputer::visitForStatement
          (NodeComplexityComputer *this,ForStatement *f)

{
  if (f->_init != (Node *)0x0) {
    this->complexity = this->complexity + 1;
  }
  if (f->_cond != (Expr *)0x0) {
    this->complexity = this->complexity + 1;
  }
  if (f->_mod != (Expr *)0x0) {
    this->complexity = this->complexity + 1;
  }
  (*(this->super_Visitor)._vptr_Visitor[0x19])();
  return;
}

Assistant:

void visitForStatement(ForStatement *f) {
    if (f->initializer())
      complexity += 1;

    if (f->condition())
      complexity += 1;

    if (f->modifier())
      complexity += 1;

    Visitor::visitForStatement(f);
  }